

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_encoder.cc
# Opt level: O0

char * __thiscall draco::PlyEncoder::GetAttributeDataType(PlyEncoder *this,int attribute)

{
  DataType DVar1;
  PointAttribute *this_00;
  int32_t in_ESI;
  PointCloud *in_RDI;
  char *local_8;
  
  this_00 = PointCloud::attribute(in_RDI,in_ESI);
  DVar1 = GeometryAttribute::data_type(&this_00->super_GeometryAttribute);
  if (DVar1 == DT_UINT8) {
    local_8 = "uchar";
  }
  else if (DVar1 == DT_INT32) {
    local_8 = "int";
  }
  else if (DVar1 == DT_FLOAT32) {
    local_8 = "float";
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char *PlyEncoder::GetAttributeDataType(int attribute) {
  // TODO(ostava): Add support for more types.
  switch (in_point_cloud_->attribute(attribute)->data_type()) {
    case DT_FLOAT32:
      return "float";
    case DT_UINT8:
      return "uchar";
    case DT_INT32:
      return "int";
    default:
      break;
  }
  return nullptr;
}